

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLoad.c
# Opt level: O0

void Abc_SclAddWireLoad(SC_Man *p,Abc_Obj_t *pObj,int fSubtr)

{
  Vec_Flt_t *vWireCaps;
  int nFans;
  SC_Pair *pSVar1;
  float local_34;
  float local_2c;
  float Load;
  int fSubtr_local;
  Abc_Obj_t *pObj_local;
  SC_Man *p_local;
  
  vWireCaps = p->vWireCaps;
  nFans = Abc_ObjFanoutNum(pObj);
  local_34 = Abc_SclFindWireLoad(vWireCaps,nFans);
  local_2c = local_34;
  if (fSubtr != 0) {
    local_2c = -local_34;
  }
  pSVar1 = Abc_SclObjLoad(p,pObj);
  pSVar1->rise = local_2c + pSVar1->rise;
  if (fSubtr != 0) {
    local_34 = -local_34;
  }
  pSVar1 = Abc_SclObjLoad(p,pObj);
  pSVar1->fall = local_34 + pSVar1->fall;
  return;
}

Assistant:

void Abc_SclAddWireLoad( SC_Man * p, Abc_Obj_t * pObj, int fSubtr )
{
    float Load = Abc_SclFindWireLoad( p->vWireCaps, Abc_ObjFanoutNum(pObj) );
    Abc_SclObjLoad(p, pObj)->rise += fSubtr ? -Load : Load;
    Abc_SclObjLoad(p, pObj)->fall += fSubtr ? -Load : Load;
}